

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_allgather_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  long lVar1;
  
  if (0 < n) {
    lVar1 = 0;
    do {
      bsc_allgather_single
                (depends,group,*(void **)((long)&set->src + lVar1),
                 *(void **)((long)&set->dst + lVar1),*(bsc_size_t *)((long)&set->size + lVar1));
      lVar1 = lVar1 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar1);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_allgather_multiple( bsc_step_t depends, 
                        bsc_pid_t root, bsc_group_t group,
                        bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    (void) root;
    for ( i = 0; i < n ; ++i )
        bsc_allgather_single( depends, group, 
                set[i].src, set[i].dst, set[i].size );
    return depends + 1;
}